

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O3

void subtract_4x4(int16_t *diff,ptrdiff_t diff_stride,uint16_t *src,ptrdiff_t src_stride,
                 uint16_t *pred,ptrdiff_t pred_stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int64_t *store_diff;
  
  uVar1 = *(undefined8 *)src;
  uVar2 = *(undefined8 *)(src + src_stride);
  uVar3 = *(undefined8 *)(src + src_stride * 2);
  uVar4 = *(undefined8 *)(src + src_stride * 3);
  uVar5 = *(undefined8 *)pred;
  uVar6 = *(undefined8 *)(pred + pred_stride);
  uVar7 = *(undefined8 *)(pred + pred_stride * 2);
  uVar8 = *(undefined8 *)(pred + pred_stride * 3);
  *(ulong *)diff =
       CONCAT26((short)((ulong)uVar1 >> 0x30) - (short)((ulong)uVar5 >> 0x30),
                CONCAT24((short)((ulong)uVar1 >> 0x20) - (short)((ulong)uVar5 >> 0x20),
                         CONCAT22((short)((ulong)uVar1 >> 0x10) - (short)((ulong)uVar5 >> 0x10),
                                  (short)uVar1 - (short)uVar5)));
  *(ulong *)(diff + diff_stride) =
       CONCAT26((short)((ulong)uVar2 >> 0x30) - (short)((ulong)uVar6 >> 0x30),
                CONCAT24((short)((ulong)uVar2 >> 0x20) - (short)((ulong)uVar6 >> 0x20),
                         CONCAT22((short)((ulong)uVar2 >> 0x10) - (short)((ulong)uVar6 >> 0x10),
                                  (short)uVar2 - (short)uVar6)));
  *(ulong *)(diff + diff_stride * 2) =
       CONCAT26((short)((ulong)uVar3 >> 0x30) - (short)((ulong)uVar7 >> 0x30),
                CONCAT24((short)((ulong)uVar3 >> 0x20) - (short)((ulong)uVar7 >> 0x20),
                         CONCAT22((short)((ulong)uVar3 >> 0x10) - (short)((ulong)uVar7 >> 0x10),
                                  (short)uVar3 - (short)uVar7)));
  *(ulong *)(diff + diff_stride * 3) =
       CONCAT26((short)((ulong)uVar4 >> 0x30) - (short)((ulong)uVar8 >> 0x30),
                CONCAT24((short)((ulong)uVar4 >> 0x20) - (short)((ulong)uVar8 >> 0x20),
                         CONCAT22((short)((ulong)uVar4 >> 0x10) - (short)((ulong)uVar8 >> 0x10),
                                  (short)uVar4 - (short)uVar8)));
  return;
}

Assistant:

static void subtract_4x4(int16_t *diff, ptrdiff_t diff_stride,
                         const uint16_t *src, ptrdiff_t src_stride,
                         const uint16_t *pred, ptrdiff_t pred_stride) {
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3;
  __m128i x0, x1, x2, x3;
  int64_t *store_diff = (int64_t *)(diff + 0 * diff_stride);

  u0 = _mm_loadl_epi64((__m128i const *)(src + 0 * src_stride));
  u1 = _mm_loadl_epi64((__m128i const *)(src + 1 * src_stride));
  u2 = _mm_loadl_epi64((__m128i const *)(src + 2 * src_stride));
  u3 = _mm_loadl_epi64((__m128i const *)(src + 3 * src_stride));

  v0 = _mm_loadl_epi64((__m128i const *)(pred + 0 * pred_stride));
  v1 = _mm_loadl_epi64((__m128i const *)(pred + 1 * pred_stride));
  v2 = _mm_loadl_epi64((__m128i const *)(pred + 2 * pred_stride));
  v3 = _mm_loadl_epi64((__m128i const *)(pred + 3 * pred_stride));

  x0 = _mm_sub_epi16(u0, v0);
  x1 = _mm_sub_epi16(u1, v1);
  x2 = _mm_sub_epi16(u2, v2);
  x3 = _mm_sub_epi16(u3, v3);

  _mm_storel_epi64((__m128i *)store_diff, x0);
  store_diff = (int64_t *)(diff + 1 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x1);
  store_diff = (int64_t *)(diff + 2 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x2);
  store_diff = (int64_t *)(diff + 3 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x3);
}